

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btVector3.h
# Opt level: O1

btVector3 __thiscall
btTriangleShape::localGetSupportingVertexWithoutMargin(btTriangleShape *this,btVector3 *dir)

{
  float fVar1;
  float fVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  btVector3 bVar7;
  
  fVar6 = dir->m_floats[0];
  fVar1 = dir->m_floats[1];
  fVar2 = dir->m_floats[2];
  fVar4 = this->m_vertices1[1].m_floats[2] * fVar2 +
          this->m_vertices1[1].m_floats[0] * fVar6 + this->m_vertices1[1].m_floats[1] * fVar1;
  fVar5 = this->m_vertices1[0].m_floats[2] * fVar2 +
          this->m_vertices1[0].m_floats[0] * fVar6 + this->m_vertices1[0].m_floats[1] * fVar1;
  fVar6 = this->m_vertices1[2].m_floats[2] * fVar2 +
          this->m_vertices1[2].m_floats[0] * fVar6 + this->m_vertices1[2].m_floats[1] * fVar1;
  iVar3 = (fVar4 < fVar6) + 1;
  if (fVar4 <= fVar5) {
    iVar3 = (uint)(fVar5 < fVar6) * 2;
  }
  bVar7.m_floats._8_8_ =
       *(undefined8 *)((long)this->m_vertices1[0].m_floats + (ulong)(uint)(iVar3 << 4) + 8);
  bVar7.m_floats._0_8_ =
       *(undefined8 *)((long)this->m_vertices1[0].m_floats + (ulong)(uint)(iVar3 << 4));
  return (btVector3)bVar7.m_floats;
}

Assistant:

SIMD_FORCE_INLINE btScalar dot(const btVector3& v) const
	{
#if defined BT_USE_SIMD_VECTOR3 && defined (BT_USE_SSE_IN_API) && defined (BT_USE_SSE)
		__m128 vd = _mm_mul_ps(mVec128, v.mVec128);
		__m128 z = _mm_movehl_ps(vd, vd);
		__m128 y = _mm_shuffle_ps(vd, vd, 0x55);
		vd = _mm_add_ss(vd, y);
		vd = _mm_add_ss(vd, z);
		return _mm_cvtss_f32(vd);
#elif defined(BT_USE_NEON)
		float32x4_t vd = vmulq_f32(mVec128, v.mVec128);
		float32x2_t x = vpadd_f32(vget_low_f32(vd), vget_low_f32(vd));
		x = vadd_f32(x, vget_high_f32(vd));
		return vget_lane_f32(x, 0);
#else
		return	m_floats[0] * v.m_floats[0] +
				m_floats[1] * v.m_floats[1] +
				m_floats[2] * v.m_floats[2];
#endif
	}